

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::add_clipboard_notify(Fl_Clipboard_Notify_Handler h,void *data)

{
  Clipboard_Notify *pCVar1;
  
  remove_clipboard_notify(h);
  pCVar1 = (Clipboard_Notify *)operator_new(0x18);
  pCVar1->handler = h;
  pCVar1->data = data;
  pCVar1->next = clip_notify_list;
  clip_notify_list = pCVar1;
  fl_clipboard_notify_change();
  return;
}

Assistant:

void Fl::add_clipboard_notify(Fl_Clipboard_Notify_Handler h, void *data) {
  struct Clipboard_Notify *node;

  remove_clipboard_notify(h);

  node = new Clipboard_Notify;

  node->handler = h;
  node->data = data;
  node->next = clip_notify_list;

  clip_notify_list = node;

  fl_clipboard_notify_change();
}